

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall
ON_Viewport::GetFrustumLine(ON_Viewport *this,double screenx,double screeny,ON_Line *world_line)

{
  bool bVar1;
  ON_Line line;
  ON_3dPoint c;
  ON_Xform s2c;
  ON_Xform c2w;
  ON_Line local_188;
  ON_3dPoint local_150;
  ON_3dPoint local_138;
  ON_Xform local_120;
  ON_Xform local_a0;
  
  ON_Xform::ON_Xform(&local_120);
  ON_Xform::ON_Xform(&local_a0);
  ON_Line::ON_Line(&local_188);
  bVar1 = GetXform(this,screen_cs,clip_cs,&local_120);
  if (bVar1) {
    bVar1 = GetXform(this,clip_cs,world_cs,&local_a0);
  }
  if (bVar1 != false) {
    local_138.x = local_120.m_xform[0][0] * screenx + local_120.m_xform[0][1] * screeny +
                  local_120.m_xform[0][3];
    local_138.y = screenx * local_120.m_xform[1][0] + screeny * local_120.m_xform[1][1] +
                  local_120.m_xform[1][3];
    local_138.z = 1.0;
    ON_Xform::operator*(&local_150,&local_a0,&local_138);
    local_188.to.z = local_150.z;
    local_188.to.x = local_150.x;
    local_188.to.y = local_150.y;
    local_138.z = -1.0;
    ON_Xform::operator*(&local_150,&local_a0,&local_138);
    local_188.from.z = local_150.z;
    local_188.from.x = local_150.x;
    local_188.from.y = local_150.y;
    (world_line->to).y = local_188.to.y;
    (world_line->to).z = local_188.to.z;
    (world_line->from).z = local_150.z;
    (world_line->to).x = local_188.to.x;
    (world_line->from).x = local_150.x;
    (world_line->from).y = local_150.y;
  }
  ON_Line::~ON_Line(&local_188);
  return bVar1;
}

Assistant:

bool ON_Viewport::GetFrustumLine( double screenx, double screeny, ON_Line& world_line ) const
{
  ON_Xform s2c, c2w;
  ON_3dPoint c;
  ON_Line line;
  bool rc;

  rc = GetXform( ON::screen_cs, ON::clip_cs, s2c );
  if ( rc )
    rc = GetXform( ON::clip_cs, ON::world_cs, c2w );
  if (rc )
  {
    // c = mouse point on near clipping plane
    c.x = s2c.m_xform[0][0]*screenx + s2c.m_xform[0][1]*screeny + s2c.m_xform[0][3];
    c.y = s2c.m_xform[1][0]*screenx + s2c.m_xform[1][1]*screeny + s2c.m_xform[1][3];
    c.z = 1.0;
    line.to = c2w*c;   // line.to = near plane mouse point in world coords
    c.z = -1.0;
    line.from = c2w*c; // line.from = far plane mouse point in world coords

    world_line = line;
  }
  return rc;
}